

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O3

bool Diligent::PipelineResourceSignaturesCompatible
               (PipelineResourceSignatureDesc *Desc0,PipelineResourceSignatureDesc *Desc1,
               bool IgnoreSamplerDescriptions)

{
  PipelineResourceDesc *pPVar1;
  PipelineResourceDesc *pPVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  if ((Desc0->BindingIndex == Desc1->BindingIndex) &&
     (uVar4 = Desc0->NumResources, uVar4 == Desc1->NumResources)) {
    if ((ulong)uVar4 != 0) {
      pPVar1 = Desc0->Resources;
      pPVar2 = Desc1->Resources;
      lVar5 = 0;
      do {
        if (*(int *)((long)&pPVar1->ShaderStages + lVar5) !=
            *(int *)((long)&pPVar2->ShaderStages + lVar5)) {
          return false;
        }
        if (*(int *)((long)&pPVar1->ArraySize + lVar5) != *(int *)((long)&pPVar2->ArraySize + lVar5)
           ) {
          return false;
        }
        if ((&pPVar1->ResourceType)[lVar5] != (&pPVar2->ResourceType)[lVar5]) {
          return false;
        }
        if ((&pPVar1->VarType)[lVar5] != (&pPVar2->VarType)[lVar5]) {
          return false;
        }
        if ((&pPVar1->Flags)[lVar5] != (&pPVar2->Flags)[lVar5]) {
          return false;
        }
        lVar5 = lVar5 + 0x18;
      } while ((ulong)uVar4 * 0x18 != lVar5);
    }
    uVar4 = Desc0->NumImmutableSamplers;
    if (uVar4 == Desc1->NumImmutableSamplers) {
      if (uVar4 == 0) {
        return true;
      }
      lVar5 = 0x10;
      uVar6 = 0;
      while( true ) {
        if (*(int *)((long)(Desc0->ImmutableSamplers->Desc).BorderColor + lVar5 + -0x3c) !=
            *(int *)((long)(Desc1->ImmutableSamplers->Desc).BorderColor + lVar5 + -0x3c)) break;
        if (!IgnoreSamplerDescriptions) {
          bVar3 = SamplerDesc::operator==
                            ((SamplerDesc *)
                             ((long)(Desc0->ImmutableSamplers->Desc).BorderColor + lVar5 + -0x2c),
                             (SamplerDesc *)
                             ((long)(Desc1->ImmutableSamplers->Desc).BorderColor + lVar5 + -0x2c));
          if (!bVar3) {
            return false;
          }
          uVar4 = Desc0->NumImmutableSamplers;
        }
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x48;
        if (uVar4 <= uVar6) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool PipelineResourceSignaturesCompatible(const PipelineResourceSignatureDesc& Desc0,
                                          const PipelineResourceSignatureDesc& Desc1,
                                          bool                                 IgnoreSamplerDescriptions) noexcept
{
    if (Desc0.BindingIndex != Desc1.BindingIndex)
        return false;

    if (Desc0.NumResources != Desc1.NumResources)
        return false;

    for (Uint32 r = 0; r < Desc0.NumResources; ++r)
    {
        if (!PipelineResourcesCompatible(Desc0.Resources[r], Desc1.Resources[r]))
            return false;
    }

    if (Desc0.NumImmutableSamplers != Desc1.NumImmutableSamplers)
        return false;

    for (Uint32 s = 0; s < Desc0.NumImmutableSamplers; ++s)
    {
        const ImmutableSamplerDesc& Samp0 = Desc0.ImmutableSamplers[s];
        const ImmutableSamplerDesc& Samp1 = Desc1.ImmutableSamplers[s];

        if (Samp0.ShaderStages != Samp1.ShaderStages)
            return false;

        if (!IgnoreSamplerDescriptions && Samp0.Desc != Samp1.Desc)
            return false;
    }

    return true;
}